

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorProto::SharedDtor(FileDescriptorProto *this)

{
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  Arena *pAVar1;
  LogMessage *other;
  string *psVar2;
  FileDescriptorProto *pFVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  FileDescriptorProto *local_10;
  FileDescriptorProto *this_local;
  
  local_10 = this;
  pAVar1 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  local_49 = 0;
  if (pAVar1 != (Arena *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x624);
    local_49 = 1;
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->name_,psVar2);
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->package_,psVar2);
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->syntax_,psVar2);
  pFVar3 = internal_default_instance();
  if ((this != pFVar3) && (this_00 = this->options_, this_00 != (FileOptions *)0x0)) {
    FileOptions::~FileOptions(this_00);
    operator_delete(this_00);
  }
  pFVar3 = internal_default_instance();
  if ((this != pFVar3) && (this_01 = this->source_code_info_, this_01 != (SourceCodeInfo *)0x0)) {
    SourceCodeInfo::~SourceCodeInfo(this_01);
    operator_delete(this_01);
  }
  return;
}

Assistant:

inline void FileDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  package_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  syntax_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
  if (this != internal_default_instance()) delete source_code_info_;
}